

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable_binary.hpp
# Opt level: O3

void __thiscall
cereal::PortableBinaryOutputArchive::saveBinary<8ul>
          (PortableBinaryOutputArchive *this,void *data,size_t size)

{
  long lVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  ulong uVar5;
  unsigned_long __val;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->itsConvertEndianness == '\0') {
    plVar2 = *(long **)(this->itsStream + *(long *)(*(long *)this->itsStream + -0x18) + 0xe8);
    __val = (**(code **)(*plVar2 + 0x60))(plVar2,data,size);
  }
  else if (size == 0) {
    __val = 0;
  }
  else {
    uVar5 = 0;
    __val = 0;
    do {
      lVar4 = 7;
      do {
        plVar2 = *(long **)(this->itsStream + *(long *)(*(long *)this->itsStream + -0x18) + 0xe8);
        lVar1 = (**(code **)(*plVar2 + 0x60))(plVar2,(long)data + lVar4,1);
        __val = __val + lVar1;
        bVar6 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar6);
      uVar5 = uVar5 + 8;
      data = (void *)((long)data + 8);
    } while (uVar5 < size);
  }
  if (__val != size) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_b0,size);
    std::operator+(&local_70,"Failed to write ",&local_b0);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
      local_d0.field_2._M_allocated_capacity = *psVar3;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar3;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::to_string(&local_90,__val);
    std::operator+(&local_50,&local_d0,&local_90);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_002e77b8;
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

inline
      void saveBinary( const void * data, std::size_t size )
      {
        std::size_t writtenSize = 0;

        if( itsConvertEndianness )
        {
          for( std::size_t i = 0; i < size; i += DataSize )
            for( std::size_t j = 0; j < DataSize; ++j )
              writtenSize += static_cast<std::size_t>( itsStream.rdbuf()->sputn( reinterpret_cast<const char*>( data ) + DataSize - j - 1 + i, 1 ) );
        }
        else
          writtenSize = static_cast<std::size_t>( itsStream.rdbuf()->sputn( reinterpret_cast<const char*>( data ), size ) );

        if(writtenSize != size)
          throw Exception("Failed to write " + std::to_string(size) + " bytes to output stream! Wrote " + std::to_string(writtenSize));
      }